

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t * gs_eval_stmt_block(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_stmt_t *stmt)

{
  int iVar1;
  gs_val_t local_40;
  int local_24;
  map_base_t *pmStack_20;
  int i;
  gs_env_t *env;
  gs_stmt_t *stmt_local;
  gs_eval_t *eval_local;
  
  env = (gs_env_t *)stmt;
  stmt_local = (gs_stmt_t *)eval;
  pmStack_20 = (map_base_t *)
               golf_alloc_tracked(0x38,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/script.c"
                                 );
  memset(pmStack_20,0,0x38);
  pmStack_20[3].buckets = (map_node_t **)"script/eval";
  iVar1 = vec_expand_((char **)&(stmt_local->field_1).fn_decl.arg_types,
                      (int *)((long)&stmt_local->field_1 + 0x30),
                      (int *)((long)&stmt_local->field_1 + 0x34),8,
                      (char *)(stmt_local->field_1).for_stmt.body);
  if (iVar1 == 0) {
    iVar1 = *(int *)((long)&stmt_local->field_1 + 0x30);
    *(int *)((long)&stmt_local->field_1 + 0x30) = iVar1 + 1;
    *(map_base_t **)(&((stmt_local->field_1).for_stmt.cond)->type + (long)iVar1 * 2) = pmStack_20;
  }
  for (local_24 = 0; local_24 < (int)(env->val_map).base.nbuckets; local_24 = local_24 + 1) {
    gs_eval_stmt(&local_40,(gs_eval_t *)stmt_local,
                 *(gs_stmt_t **)(&((env->val_map).ref)->type + (long)local_24 * 2));
    __return_storage_ptr__->type = local_40.type;
    __return_storage_ptr__->is_return = local_40.is_return;
    *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_40._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_40.field_2.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
    if ((__return_storage_ptr__->is_return & 1U) != 0) break;
  }
  map_deinit_(pmStack_20);
  golf_free_tracked(pmStack_20);
  *(int *)((long)&stmt_local->field_1 + 0x30) = *(int *)((long)&stmt_local->field_1 + 0x30) + -1;
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_eval_stmt_block(gs_eval_t *eval, gs_stmt_t *stmt) {
    gs_val_t val;
    gs_env_t *env = golf_alloc(sizeof(gs_env_t));
    map_init(&env->val_map, "script/eval");
    vec_push(&eval->env, env);

    for (int i = 0; i < stmt->block_stmt.num_stmts; i++) {
        val = gs_eval_stmt(eval, stmt->block_stmt.stmts[i]);
        if (val.is_return) goto cleanup;
    }

cleanup:
    map_deinit(&env->val_map);
    golf_free(env);
    (void)vec_pop(&eval->env);
    return val;
}